

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O1

string * __thiscall
booster::aio::endpoint::path_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  char *__s;
  data *pdVar1;
  family_type fVar2;
  size_t sVar3;
  endpoint *this_00;
  
  this_00 = this;
  fVar2 = family(this);
  if (fVar2 == pf_unix) {
    pdVar1 = (this->d).ptr_;
    __s = (pdVar1->sa).un.sun_path;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,(long)&pdVar1->sa + sVar3 + 2);
    return __return_storage_ptr__;
  }
  throw_invalid(this_00);
}

Assistant:

std::string endpoint::path() const
{
	if(family()!=pf_unix)
		throw_invalid();
	return d->sa.un.sun_path;
}